

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

StringRef __thiscall
Catch::Generators::GeneratorUntypedBase::currentElementAsString(GeneratorUntypedBase *this)

{
  size_type sVar1;
  StringRef SVar2;
  long *local_38 [2];
  long local_28 [2];
  
  sVar1 = (this->m_stringReprCache)._M_string_length;
  if (sVar1 == 0) {
    (*this->_vptr_GeneratorUntypedBase[1])(local_38,this);
    std::__cxx11::string::operator=((string *)&this->m_stringReprCache,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    sVar1 = (this->m_stringReprCache)._M_string_length;
  }
  SVar2.m_size = sVar1;
  SVar2.m_start = (this->m_stringReprCache)._M_dataplus._M_p;
  return SVar2;
}

Assistant:

StringRef GeneratorUntypedBase::currentElementAsString() const {
            if ( m_stringReprCache.empty() ) {
                m_stringReprCache = stringifyImpl();
            }
            return m_stringReprCache;
        }